

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

AtomicSort * Kernel::AtomicSort::create(uint typeCon,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  Cell *pCVar3;
  uint64_t *puVar4;
  TermSharing *pTVar5;
  uint uVar6;
  AtomicSort *pAVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  Cell *pCVar13;
  TermList *pTVar14;
  ulong uVar15;
  size_t i_1;
  bool bVar16;
  bool bVar17;
  Cell *local_48;
  uint local_3c;
  uint64_t local_38;
  
  pTVar5 = DAT_00b521b8;
  uVar8 = (ulong)arity;
  if (arity != 0) {
    bVar16 = false;
    uVar10 = 1;
    do {
      uVar15 = args[uVar10 - 1]._content;
      if ((uVar15 & 1) == 0) {
        if ((*(byte *)(uVar15 + 0x28) & 8) == 0) {
LAB_005c0a73:
          if (!bVar16) {
            pAVar7 = (AtomicSort *)Term::operator_new(uVar15,arity,0);
            (pAVar7->super_Term)._weight = 0;
            (pAVar7->super_Term)._kboWeight = -1;
            (pAVar7->super_Term)._maxRedLen = 0;
            (pAVar7->super_Term).field_9._vars = 0;
            (pAVar7->super_Term)._vptr_Term = (_func_int **)&PTR_computable_00b3d6d0;
            (pAVar7->super_Term)._args[0]._content = 0xfffffc22;
            (pAVar7->super_Term)._functor = typeCon;
            *(uint *)&(pAVar7->super_Term).field_0xc = arity & 0xfffffff;
            (pAVar7->super_Term)._args[arity & 0xfffffff]._content = args->_content;
            if (arity == 1) {
              return pAVar7;
            }
            uVar8 = 2;
            if (2 < arity) {
              uVar8 = (ulong)arity;
            }
            uVar10 = 1;
            iVar12 = -1;
            do {
              pTVar14 = args + uVar10;
              uVar10 = uVar10 + 1;
              (pAVar7->super_Term)._args
              [(int)((*(uint *)&(pAVar7->super_Term).field_0xc & 0xfffffff) + iVar12)]._content =
                   pTVar14->_content;
              iVar12 = iVar12 + -1;
            } while (uVar8 != uVar10);
            return pAVar7;
          }
          break;
        }
      }
      else {
        uVar6 = (uint)uVar15;
        uVar15 = (ulong)~uVar6;
        if ((~uVar6 & 3) == 0) goto LAB_005c0a73;
      }
      bVar16 = uVar8 <= uVar10;
      bVar17 = uVar10 != uVar8;
      uVar10 = uVar10 + 1;
    } while (bVar17);
  }
  local_3c = typeCon;
  uVar6 = 0x811c9dc5;
  lVar9 = 0;
  do {
    uVar6 = (*(byte *)((long)&local_3c + lVar9) ^ uVar6) * 0x1000193;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  if (arity != 0) {
    uVar10 = 0;
    do {
      local_38 = args[uVar10]._content;
      uVar11 = 0x811c9dc5;
      lVar9 = 0;
      do {
        uVar11 = (*(byte *)((long)&local_38 + lVar9) ^ uVar11) * 0x1000193;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      uVar10 = uVar10 + 1;
      uVar6 = (uVar11 ^ uVar6) * 0x1000193;
    } while (uVar10 != uVar8);
  }
  uVar10 = 2;
  if (2 < uVar6) {
    uVar10 = (ulong)uVar6;
  }
  if ((DAT_00b521b8->_sorts)._maxEntries <= (DAT_00b521b8->_sorts)._nonemptyCells) {
    Lib::Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::expand(&DAT_00b521b8->_sorts);
  }
  pCVar3 = (pTVar5->_sorts)._entries;
  local_48 = (Cell *)0x0;
  pCVar13 = pCVar3 + uVar10 % (ulong)(uint)(pTVar5->_sorts)._capacity;
  do {
    uVar6 = pCVar13->code;
    if (uVar6 == 0) {
      if (local_48 == (Cell *)0x0) {
        piVar1 = &(pTVar5->_sorts)._nonemptyCells;
        *piVar1 = *piVar1 + 1;
        local_48 = pCVar13;
      }
      puVar2 = &(pTVar5->_sorts)._size;
      *puVar2 = *puVar2 + 1;
      pAVar7 = (AtomicSort *)Term::operator_new((ulong)uVar6,arity,0);
      (pAVar7->super_Term)._weight = 0;
      (pAVar7->super_Term)._kboWeight = -1;
      (pAVar7->super_Term)._maxRedLen = 0;
      (pAVar7->super_Term).field_9._vars = 0;
      (pAVar7->super_Term)._vptr_Term = (_func_int **)&PTR_computable_00b3d6d0;
      (pAVar7->super_Term)._args[0]._content = 0xfffffc22;
      (pAVar7->super_Term)._functor = typeCon;
      *(uint *)&(pAVar7->super_Term).field_0xc = arity & 0xfffffff;
      if ((arity != 0) &&
         ((pAVar7->super_Term)._args[arity & 0xfffffff]._content = args->_content, arity != 1)) {
        pTVar14 = args + 1;
        lVar9 = -1;
        do {
          (pAVar7->super_Term)._args
          [(int)((*(uint *)&(pAVar7->super_Term).field_0xc & 0xfffffff) + (int)lVar9)]._content =
               pTVar14->_content;
          pTVar14 = pTVar14 + 1;
          lVar9 = lVar9 + -1;
        } while (-lVar9 != uVar8);
      }
      local_48->value = pAVar7;
      local_48->code = (uint)uVar10;
      Indexing::TermSharing::computeAndSetSharedSortData(DAT_00b521b8,pAVar7);
      return pAVar7;
    }
    if (uVar6 == 1) {
      if (local_48 == (Cell *)0x0) {
        local_48 = pCVar13;
      }
    }
    else if ((uVar6 == (uint)uVar10) &&
            (pAVar7 = pCVar13->value, (pAVar7->super_Term)._functor == typeCon)) {
      lVar9 = 0;
      pTVar14 = args;
      do {
        if (-lVar9 == uVar8) {
          return pAVar7;
        }
        iVar12 = (int)lVar9;
        puVar4 = &pTVar14->_content;
        lVar9 = lVar9 + -1;
        pTVar14 = pTVar14 + 1;
      } while (*puVar4 ==
               (pAVar7->super_Term)._args
               [(int)((*(uint *)&(pAVar7->super_Term).field_0xc & 0xfffffff) + iVar12)]._content);
    }
    pCVar13 = pCVar13 + 1;
    if (pCVar13 == (pTVar5->_sorts)._afterLast) {
      pCVar13 = pCVar3;
    }
  } while( true );
}

Assistant:

AtomicSort* AtomicSort::create(unsigned typeCon, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->typeConArity(typeCon), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    AtomicSort* s = new(arity) AtomicSort(typeCon,arity);
    s->makeSymbol(typeCon,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_sorts.rawFindOrInsert(allocTerm,
        Term::termHash(typeCon, [&](auto i){ return args[i]; }, arity),
        [&](AtomicSort* t) { return t->functor() == typeCon && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created
        );
    if (created) {
      env.sharing->computeAndSetSharedSortData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}